

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O1

void __thiscall
Equality_modelNotEqualByComponents_Test::~Equality_modelNotEqualByComponents_Test
          (Equality_modelNotEqualByComponents_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Equality, modelNotEqualByComponents)
{
    libcellml::ModelPtr m1 = libcellml::Model::create();
    libcellml::ModelPtr m2 = libcellml::Model::create();

    libcellml::ComponentPtr c1 = libcellml::Component::create("c1");
    libcellml::ComponentPtr c2 = libcellml::Component::create("c2");

    m1->addComponent(c1);
    m2->addComponent(c2);

    EXPECT_FALSE(m1->equals(m2));
    EXPECT_FALSE(m2->equals(m1));
}